

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.h
# Opt level: O2

void __thiscall GmmLib::MidLevelTable::~MidLevelTable(MidLevelTable *this)

{
  LastLevelTable *pLVar1;
  LastLevelTable *this_00;
  
  this_00 = this->pTTL1;
  if (this_00 != (LastLevelTable *)0x0) {
    while (this_00 != (LastLevelTable *)0x0) {
      pLVar1 = this_00->pNext;
      LastLevelTable::~LastLevelTable(this_00);
      operator_delete(this_00);
      this_00 = pLVar1;
    }
    this->pTTL1 = (LastLevelTable *)0x0;
  }
  return;
}

Assistant:

~MidLevelTable()
        {
            if (pTTL1)
            {
                LastLevelTable* item = pTTL1;

                while (item)
                {
                    LastLevelTable* nextItem = item->Next();
                    delete item;
                    item = nextItem;
                }

                pTTL1 = NULL;
            }
        }